

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O0

exr_result_t exr_attr_opaquedata_destroy(exr_context_t ctxt,exr_attr_opaquedata_t *ud)

{
  void *in_RSI;
  long in_RDI;
  exr_attr_opaquedata_t nil;
  _internal_exr_context *pctxt;
  undefined1 auStack_58 [56];
  long local_20;
  void *local_18;
  long local_10;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (void *)0x0) {
      local_20 = in_RDI;
      local_18 = in_RSI;
      local_10 = in_RDI;
      memset(auStack_58,0,0x38);
      if ((*(long *)((long)local_18 + 0x10) != 0) && (0 < *(int *)((long)local_18 + 8))) {
        (**(code **)(local_20 + 0x60))(*(undefined8 *)((long)local_18 + 0x10));
      }
      if ((*(long *)((long)local_18 + 0x18) != 0) && (*(long *)((long)local_18 + 0x30) != 0)) {
        (**(code **)((long)local_18 + 0x30))
                  (local_10,*(undefined8 *)((long)local_18 + 0x18),
                   *(undefined4 *)((long)local_18 + 4));
      }
      memcpy(local_18,auStack_58,0x38);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_opaquedata_destroy (exr_context_t ctxt, exr_attr_opaquedata_t* ud)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (ud)
    {
        exr_attr_opaquedata_t nil = {0};
        if (ud->packed_data && ud->packed_alloc_size > 0)
            pctxt->free_fn (ud->packed_data);

        if (ud->unpacked_data && ud->destroy_unpacked_func_ptr)
            ud->destroy_unpacked_func_ptr (
                ctxt, ud->unpacked_data, ud->unpacked_size);
        *ud = nil;
    }
    return EXR_ERR_SUCCESS;
}